

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O2

QRect __thiscall QStatusBarPrivate::messageRect(QStatusBarPrivate *this)

{
  QWidget *this_00;
  QWidget *pQVar1;
  QWidgetData *pQVar2;
  SBItem *pSVar3;
  LayoutDirection LVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  QRect QVar11;
  
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  LVar4 = QWidget::layoutDirection(this_00);
  iVar9 = ((this_00->data->crect).x2.m_i - (this_00->data->crect).x1.m_i) + -0xb;
  pQVar1 = &this->resizer->super_QWidget;
  uVar6 = 6;
  iVar5 = iVar9;
  if (((pQVar1 != (QWidget *)0x0) && ((pQVar1->data->widget_attributes & 0x8000) != 0)) &&
     (iVar5 = QWidget::x(pQVar1), LVar4 == RightToLeft)) {
    pQVar2 = (this->resizer->super_QWidget).data;
    uVar6 = ((iVar5 + (pQVar2->crect).x2.m_i) - (pQVar2->crect).x1.m_i) + 1;
    iVar5 = iVar9;
  }
  pSVar3 = (this->items).d.ptr;
  lVar10 = 0;
  do {
    iVar9 = iVar5;
    if ((this->items).d.size << 4 == lVar10) {
LAB_0044af91:
      QVar11.y1.m_i = 0;
      QVar11.x1.m_i = uVar6;
      QVar11.y2.m_i = (this_00->data->crect).y2.m_i - (this_00->data->crect).y1.m_i;
      QVar11.x2.m_i = iVar9 + -1;
      return QVar11;
    }
    if ((*(int *)((long)&pSVar3->category + lVar10) == 1) &&
       (pQVar1 = *(QWidget **)((long)&pSVar3->widget + lVar10),
       (pQVar1->data->widget_attributes & 0x8000) != 0)) {
      iVar7 = QWidget::x(pQVar1);
      if (LVar4 == RightToLeft) {
        lVar10 = *(long *)(*(long *)((long)&pSVar3->widget + lVar10) + 0x20);
        uVar8 = ((iVar7 + *(int *)(lVar10 + 0x1c)) - *(int *)(lVar10 + 0x14)) + 3;
        if ((int)uVar6 <= (int)uVar8) {
          uVar6 = uVar8;
        }
      }
      else {
        iVar9 = iVar7 + -2;
        if (iVar5 < iVar7 + -2) {
          iVar9 = iVar5;
        }
      }
      goto LAB_0044af91;
    }
    lVar10 = lVar10 + 0x10;
  } while( true );
}

Assistant:

QRect QStatusBarPrivate::messageRect() const
{
    Q_Q(const QStatusBar);
    const bool rtl = q->layoutDirection() == Qt::RightToLeft;

    int left = 6;
    int right = q->width() - 12;

#if QT_CONFIG(sizegrip)
    if (resizer && resizer->isVisible()) {
        if (rtl)
            left = resizer->x() + resizer->width();
        else
            right = resizer->x();
    }
#endif

    for (const auto &item : items) {
        if (item.isPermanent() && item.widget->isVisible()) {
            if (rtl)
                left = qMax(left, item.widget->x() + item.widget->width() + 2);
            else
                right = qMin(right, item.widget->x() - 2);
            break;
        }
    }
    return QRect(left, 0, right-left, q->height());
}